

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O3

const_iterator __thiscall VarnodeBank::beginLoc(VarnodeBank *this,int4 s,Address *addr,uint4 fl)

{
  const_iterator cVar1;
  SeqNum sq;
  PcodeOp searchop;
  Varnode *local_b0;
  SeqNum local_a8;
  PcodeOp local_90;
  
  if (fl == 0x10) {
    SeqNum::SeqNum(&local_a8,m_minimal);
    PcodeOp::PcodeOp(&local_90,0,&local_a8);
    local_b0 = &this->searchvn;
    (this->searchvn).size = s;
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = &local_90;
    cVar1 = std::
            _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
            ::_M_lower_bound(&(this->loc_tree)._M_t,
                             (_Const_Link_type)
                             (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                             ,&(this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header,
                             &local_b0);
  }
  else {
    if (fl == 8) {
      local_90.opcode = (TypeOp *)&this->searchvn;
      (this->searchvn).size = s;
      (this->searchvn).loc.base = addr->base;
      (this->searchvn).loc.offset = addr->offset;
      cVar1 = std::
              _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
              ::_M_lower_bound(&(this->loc_tree)._M_t,
                               (_Const_Link_type)
                               (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_parent,
                               &(this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header,
                               (Varnode **)&local_90);
      (this->searchvn).size = 0;
      return (const_iterator)cVar1._M_node;
    }
    SeqNum::SeqNum(&local_a8,m_maximal);
    PcodeOp::PcodeOp(&local_90,0,&local_a8);
    local_b0 = &this->searchvn;
    (this->searchvn).size = s;
    (this->searchvn).loc.base = addr->base;
    (this->searchvn).loc.offset = addr->offset;
    (this->searchvn).flags = 0x10;
    (this->searchvn).def = &local_90;
    cVar1 = std::
            _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
            ::_M_upper_bound(&(this->loc_tree)._M_t,
                             (_Const_Link_type)
                             (this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                             ,&(this->loc_tree)._M_t._M_impl.super__Rb_tree_header._M_header,
                             &local_b0);
  }
  (this->searchvn).flags = 8;
  (this->searchvn).size = 0;
  if (local_90.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (const_iterator)cVar1._M_node;
}

Assistant:

VarnodeLocSet::const_iterator VarnodeBank::beginLoc(int4 s,const Address &addr,
						    uint4 fl) const
{
  VarnodeLocSet::const_iterator iter;

  if (fl == Varnode::input) {
    searchvn.size = s;
    searchvn.loc = addr;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    return iter;
  }
  if (fl == Varnode::written) {
    SeqNum sq(Address::m_minimal); // Minimal sequence number
    PcodeOp searchop(0,sq);
    searchvn.size = s;
    searchvn.loc = addr;
    searchvn.flags = Varnode::written;
    searchvn.def = &searchop;
    iter = loc_tree.lower_bound(&searchvn);
    searchvn.size = 0;
    searchvn.flags = Varnode::input;
    return iter;
  }

  SeqNum sq(Address::m_maximal); // Maximal sequence number
  PcodeOp searchop(0,sq);
  searchvn.size = s;
  searchvn.loc = addr;
  searchvn.flags = Varnode::written;
  searchvn.def = &searchop;
  iter = loc_tree.upper_bound(&searchvn);
  searchvn.size = 0;
  searchvn.flags = Varnode::input;

  return iter;
}